

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# entropy_common.c
# Opt level: O1

size_t HUF_readStats_wksp(BYTE *huffWeight,size_t hwSize,U32 *rankStats,U32 *nbSymbolsPtr,
                         U32 *tableLogPtr,void *src,size_t srcSize,void *workSpace,size_t wkspSize,
                         int bmi2)

{
  bool bVar1;
  uint uVar2;
  ulong uVar3;
  ulong uVar4;
  ulong uVar5;
  ulong uVar6;
  size_t sVar7;
  uint uVar8;
  byte *pbVar9;
  
  if (srcSize == 0) {
    return 0xffffffffffffffb8;
  }
  uVar4 = (ulong)*src;
  if ((char)*src < '\0') {
    uVar5 = uVar4 - 0x7e >> 1;
    if (srcSize <= uVar5) {
      return 0xffffffffffffffb8;
    }
    uVar3 = uVar4 - 0x7f;
    if (hwSize <= uVar3) {
      return 0xffffffffffffffec;
    }
    if (uVar3 != 0) {
      pbVar9 = (byte *)((long)src + 1);
      uVar4 = 0;
      do {
        huffWeight[uVar4] = *pbVar9 >> 4;
        huffWeight[uVar4 + 1] = *pbVar9 & 0xf;
        uVar4 = uVar4 + 2;
        pbVar9 = pbVar9 + 1;
      } while (uVar4 < uVar3);
    }
  }
  else {
    if (srcSize <= uVar4) {
      return 0xffffffffffffffb8;
    }
    uVar3 = FSE_decompress_wksp_bmi2
                      (huffWeight,hwSize - 1,(void *)((long)src + 1),uVar4,6,workSpace,wkspSize,0);
    uVar5 = uVar4;
    if (0xffffffffffffff88 < uVar3) {
      return uVar3;
    }
  }
  rankStats[8] = 0;
  rankStats[9] = 0;
  rankStats[10] = 0;
  rankStats[0xb] = 0;
  rankStats[4] = 0;
  rankStats[5] = 0;
  rankStats[6] = 0;
  rankStats[7] = 0;
  rankStats[0] = 0;
  rankStats[1] = 0;
  rankStats[2] = 0;
  rankStats[3] = 0;
  rankStats[0xc] = 0;
  if (uVar3 == 0) {
    uVar8 = 0;
  }
  else {
    uVar8 = 0;
    uVar4 = 0;
    uVar6 = 1;
    do {
      if (0xb < (ulong)huffWeight[uVar4]) {
        return 0xffffffffffffffec;
      }
      rankStats[huffWeight[uVar4]] = rankStats[huffWeight[uVar4]] + 1;
      uVar8 = uVar8 + ((1 << (huffWeight[uVar4] & 0x1f)) >> 1);
      bVar1 = uVar6 < uVar3;
      uVar4 = uVar6;
      uVar6 = (ulong)((int)uVar6 + 1);
    } while (bVar1);
  }
  sVar7 = 0xffffffffffffffec;
  if (uVar8 != 0) {
    uVar2 = 0x1f;
    if (uVar8 != 0) {
      for (; uVar8 >> uVar2 == 0; uVar2 = uVar2 - 1) {
      }
    }
    if (uVar2 < 0xc) {
      *tableLogPtr = 0x20 - (uVar2 ^ 0x1f);
      uVar8 = (2 << ((byte)uVar2 & 0x1f)) - uVar8;
      uVar2 = 0x1f;
      if (uVar8 != 0) {
        for (; uVar8 >> uVar2 == 0; uVar2 = uVar2 - 1) {
        }
      }
      if (1 << ((byte)uVar2 & 0x1f) == uVar8) {
        uVar8 = 0x20 - (uVar2 ^ 0x1f);
        huffWeight[uVar3] = (BYTE)uVar8;
        rankStats[uVar8] = rankStats[uVar8] + 1;
        if ((rankStats[1] & 1) == 0 && 1 < rankStats[1]) {
          *nbSymbolsPtr = (int)uVar3 + 1;
          sVar7 = uVar5 + 1;
        }
      }
    }
  }
  return sVar7;
}

Assistant:

size_t HUF_readStats_wksp(BYTE* huffWeight, size_t hwSize, U32* rankStats,
                     U32* nbSymbolsPtr, U32* tableLogPtr,
                     const void* src, size_t srcSize,
                     void* workSpace, size_t wkspSize,
                     int bmi2)
{
#if DYNAMIC_BMI2
    if (bmi2) {
        return HUF_readStats_body_bmi2(huffWeight, hwSize, rankStats, nbSymbolsPtr, tableLogPtr, src, srcSize, workSpace, wkspSize);
    }
#endif
    (void)bmi2;
    return HUF_readStats_body_default(huffWeight, hwSize, rankStats, nbSymbolsPtr, tableLogPtr, src, srcSize, workSpace, wkspSize);
}